

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O3

void __thiscall AActorMover::Deactivate(AActorMover *this,AActor *activator)

{
  AActor *pAVar1;
  
  if ((this->super_APathFollower).super_AActor.field_0x499 == '\x01') {
    (this->super_APathFollower).super_AActor.field_0x499 = 0;
    pAVar1 = (this->super_APathFollower).super_AActor.tracer.field_0.p;
    if (pAVar1 != (AActor *)0x0) {
      if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        AActor::UnlinkFromWorld(pAVar1);
        pAVar1 = (this->super_APathFollower).super_AActor.tracer.field_0.p;
        (pAVar1->flags).Value = (this->super_APathFollower).super_AActor.special1;
        AActor::LinkToWorld(pAVar1,false,(sector_t *)0x0);
        (((this->super_APathFollower).super_AActor.tracer.field_0.p)->flags2).Value =
             (this->super_APathFollower).super_AActor.special2;
      }
      else {
        (this->super_APathFollower).super_AActor.tracer.field_0.p = (AActor *)0x0;
      }
    }
  }
  return;
}

Assistant:

void AActorMover::Deactivate (AActor *activator)
{
	if (bActive)
	{
		Super::Deactivate (activator);
		if (tracer != NULL)
		{
			tracer->UnlinkFromWorld ();
			tracer->flags = ActorFlags::FromInt (special1);
			tracer->LinkToWorld ();
			tracer->flags2 = ActorFlags2::FromInt (special2);
		}
	}
}